

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_dialer_get_tls(nng_dialer id,nng_tls_config **cfgp)

{
  nni_dialer *local_28;
  nni_dialer *d;
  nng_tls_config **ppnStack_18;
  int rv;
  nng_tls_config **cfgp_local;
  nng_dialer id_local;
  
  ppnStack_18 = cfgp;
  cfgp_local._0_4_ = id.id;
  d._4_4_ = nni_dialer_find(&local_28,id.id);
  cfgp_local._4_4_ = d._4_4_;
  if (d._4_4_ == 0) {
    d._4_4_ = nni_dialer_get_tls(local_28,ppnStack_18);
    nni_dialer_rele(local_28);
    cfgp_local._4_4_ = d._4_4_;
  }
  return cfgp_local._4_4_;
}

Assistant:

int
nng_dialer_get_tls(nng_dialer id, nng_tls_config **cfgp)
{
	int         rv;
	nni_dialer *d;
	if ((rv = nni_dialer_find(&d, id.id)) != 0) {
		return (rv);
	}
	rv = nni_dialer_get_tls(d, cfgp);
	nni_dialer_rele(d);
	return (rv);
}